

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::
Action<pstore::serialize::archive::void_type_(const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
::Perform(Action<pstore::serialize::archive::void_type_(const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&)>
          *this,ArgumentTuple *args)

{
  simple_struct *in_RDX;
  simple_struct *extraout_RDX;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
    in_RDX = extraout_RDX;
    if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
  }
  (*(this->fun_)._M_invoker)
            ((void_type *)this,
             (_Any_data *)
             (args->
             super__Tuple_impl<0UL,_const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&>
             ).
             super__Head_base<0UL,_const_(anonymous_namespace)::SerializeSpanFallback::simple_struct_&,_false>
             ._M_head_impl,in_RDX);
  return;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }